

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O2

void __thiscall cfd::core::ConfidentialTxOut::~ConfidentialTxOut(ConfidentialTxOut *this)

{
  ~ConfidentialTxOut(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ConfidentialTxOut() {
    // do nothing
  }